

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O1

void Sbd_StoRefObj(Sbd_Sto_t *p,int iObj,int iMirror)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  uint uVar8;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  
  if (iObj < 0) {
LAB_0053c301:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (p->pGia->nObjs <= iObj) goto LAB_0053c301;
  if (p->vRefs->nSize != iObj) {
    __assert_fail("iObj == Vec_IntSize(p->vRefs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2f1,"void Sbd_StoRefObj(Sbd_Sto_t *, int, int)");
  }
  if (iObj <= iMirror) {
    __assert_fail("iMirror < iObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2f2,"void Sbd_StoRefObj(Sbd_Sto_t *, int, int)");
  }
  pGVar5 = p->pGia->pObjs;
  Vec_IntPush(p->vRefs,0);
  if (0 < iMirror) {
    pVVar6 = p->vRefs;
    if (pVVar6->nSize <= iMirror) goto LAB_0053c2c3;
    if (pVVar6->nSize <= iObj) {
LAB_0053c320:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    piVar9 = pVVar6->pArray;
    piVar9[(uint)iObj] = piVar9[(uint)iMirror];
    if (pVVar6->nSize <= iMirror) goto LAB_0053c320;
    piVar9[(uint)iMirror] = 1;
  }
  uVar7 = *(ulong *)(pGVar5 + (uint)iObj);
  uVar10 = (uint)uVar7;
  if ((uVar7 & 0x1fffffff) == 0x1fffffff || (int)uVar10 < 0) {
    if (-1 < (int)uVar10 || (int)(uVar7 & 0x1fffffff) == 0x1fffffff) {
      return;
    }
    uVar10 = iObj - (uVar10 & 0x1fffffff);
    if ((-1 < (int)uVar10) && ((int)uVar10 < p->vMirrors->nSize)) {
      if (p->vMirrors->pArray[uVar10] != -1) {
        __assert_fail("Lit0m == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                      ,0x306,"void Sbd_StoRefObj(Sbd_Sto_t *, int, int)");
      }
      if ((int)uVar10 < p->vRefs->nSize) {
        piVar9 = p->vRefs->pArray + uVar10;
LAB_0053c2b8:
        *piVar9 = *piVar9 + 1;
        return;
      }
LAB_0053c2e2:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
    }
  }
  else {
    uVar10 = iObj - (uVar10 & 0x1fffffff);
    if (-1 < (int)uVar10) {
      iVar2 = p->vMirrors->nSize;
      if ((((int)uVar10 < iVar2) &&
          (uVar11 = iObj - ((uint)(uVar7 >> 0x20) & 0x1fffffff), -1 < (int)uVar11)) &&
         ((int)uVar11 < iVar2)) {
        piVar9 = p->vMirrors->pArray;
        uVar3 = piVar9[uVar10];
        uVar4 = piVar9[uVar11];
        uVar8 = uVar3 >> 1;
        if ((int)uVar3 < 0) {
          uVar8 = uVar10;
        }
        uVar10 = uVar4 >> 1;
        if ((int)uVar4 < 0) {
          uVar10 = uVar11;
        }
        if ((-1 < (int)uVar8) && (pVVar6 = p->vRefs, (int)uVar8 < pVVar6->nSize)) {
          piVar9 = pVVar6->pArray;
          piVar1 = piVar9 + uVar8;
          *piVar1 = *piVar1 + 1;
          if ((-1 < (int)uVar10) && ((int)uVar10 < pVVar6->nSize)) {
            piVar9 = piVar9 + uVar10;
            goto LAB_0053c2b8;
          }
        }
        goto LAB_0053c2e2;
      }
    }
  }
LAB_0053c2c3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sbd_StoRefObj( Sbd_Sto_t * p, int iObj, int iMirror )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    assert( iObj == Vec_IntSize(p->vRefs) );
    assert( iMirror < iObj );
    Vec_IntPush( p->vRefs, 0 );
//printf( "Ref %d\n", iObj );
    if ( iMirror > 0 )
    {
        Vec_IntWriteEntry( p->vRefs, iObj, Vec_IntEntry(p->vRefs, iMirror) );
        Vec_IntWriteEntry( p->vRefs, iMirror, 1 );
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        int Lit0m = Vec_IntEntry( p->vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        int Lit1m = Vec_IntEntry( p->vMirrors, Gia_ObjFaninId1(pObj, iObj) );
        int Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, iObj);
        int Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, iObj);
        Vec_IntAddToEntry( p->vRefs, Fan0, 1 );
        Vec_IntAddToEntry( p->vRefs, Fan1, 1 );
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        int Lit0m = Vec_IntEntry( p->vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        assert( Lit0m == -1 );
        Vec_IntAddToEntry( p->vRefs, Gia_ObjFaninId0(pObj, iObj), 1 );
    }
}